

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Bmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Bmc_AndPar_t *pPars;
  Bmc_AndPar_t Pars;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  unique0x10000435 = argv;
  memset((Bmc_AndPar_t *)&pPars,0,0x3c);
  pPars._0_4_ = 0;
  pPars._4_4_ = 0;
  Pars.nStart = 0x32;
  Pars.nFramesMax = 0;
  Pars.nFramesAdd = 0;
  Pars.nConfLimit = 0;
  Pars.nTimeOut = 0;
  Pars.fLoadCnf = 0;
  Pars.fDumpFrames = 1;
  Pars.fUseSynth = 0;
  Pars.fUseOldCnf = 0;
  Pars.fVerbose = 0;
  Pars.fVeryVerbose = 0;
  Pars.fNotVerbose = 0;
  Pars.iFrame = 0;
  Extra_UtilGetoptReset();
LAB_00260ef6:
  do {
    Pars.nFailOuts = Extra_UtilGetopt(argc,stack0xffffffffffffffd8,"SFATdscvwh");
    if (Pars.nFailOuts == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Bmc(): There is no AIG.\n");
        return 0;
      }
      if ((Pars.fDumpFrames == 0) && (iVar2 = Sdm_ManCanRead(), iVar2 == 0)) {
        Abc_Print(-1,"Abc_CommandAbc9Bmc(): Cannot input precomputed DSD information.\n");
        return 0;
      }
      iVar2 = Gia_ManBmcPerform(pAbc->pGia,(Bmc_AndPar_t *)&pPars);
      pAbc->Status = iVar2;
      pAbc->nFrames = Pars.fVeryVerbose;
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      return 0;
    }
    switch(Pars.nFailOuts) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_00261209;
      }
      Pars.nStart = atoi(stack0xffffffffffffffd8[globalUtilOptind]);
      uVar1 = Pars.nStart;
      break;
    default:
      goto LAB_00261209;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00261209;
      }
      pPars._4_4_ = atoi(stack0xffffffffffffffd8[globalUtilOptind]);
      uVar1 = pPars._4_4_;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_00261209;
      }
      pPars._0_4_ = atoi(stack0xffffffffffffffd8[globalUtilOptind]);
      uVar1 = (uint)pPars;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_00261209;
      }
      Pars.nFramesAdd = atoi(stack0xffffffffffffffd8[globalUtilOptind]);
      uVar1 = Pars.nFramesAdd;
      break;
    case 99:
      Pars.fDumpFrames = Pars.fDumpFrames ^ 1;
      goto LAB_00260ef6;
    case 100:
      Pars.nTimeOut = Pars.nTimeOut ^ 1;
      goto LAB_00260ef6;
    case 0x68:
      goto LAB_00261209;
    case 0x73:
      Pars.fLoadCnf = Pars.fLoadCnf ^ 1;
      goto LAB_00260ef6;
    case 0x76:
      Pars.fUseSynth = Pars.fUseSynth ^ 1;
      goto LAB_00260ef6;
    case 0x77:
      Pars.fUseOldCnf = Pars.fUseOldCnf ^ 1;
      goto LAB_00260ef6;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar1 < 0) {
LAB_00261209:
      Abc_Print(-2,"usage: &bmc [-SFAT num] [-dscvwh]\n");
      Abc_Print(-2,"\t         performs bounded model checking\n");
      Abc_Print(-2,"\t-S num : the starting timeframe [default = %d]\n",(ulong)(uint)pPars);
      Abc_Print(-2,"\t-F num : the maximum number of timeframes [default = %d]\n",(ulong)pPars._4_4_
               );
      Abc_Print(-2,"\t-A num : the number of additional frames to unroll [default = %d]\n",
                (ulong)(uint)Pars.nStart);
      Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",
                (ulong)(uint)Pars.nFramesAdd);
      pcVar3 = "no";
      if (Pars.nTimeOut != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle dumping unfolded timeframes [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fLoadCnf != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle synthesizing unrolled timeframes [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fDumpFrames != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle using old CNF computation [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseSynth != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseOldCnf != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing information about unfolding [default = %s]\n",pcVar3)
      ;
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Bmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Bmc_AndPar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_AndPar_t) );
    pPars->nStart        =    0;  // starting timeframe
    pPars->nFramesMax    =    0;  // maximum number of timeframes 
    pPars->nFramesAdd    =   50;  // the number of additional frames
    pPars->nConfLimit    =    0;  // maximum number of conflicts at a node
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->fLoadCnf      =    0;  // dynamic CNF loading
    pPars->fDumpFrames   =    0;  // dump unrolled timeframes
    pPars->fUseSynth     =    0;  // use synthesis
    pPars->fUseOldCnf    =    1;  // use old CNF construction
    pPars->fVerbose      =    0;  // verbose 
    pPars->fVeryVerbose  =    0;  // very verbose 
    pPars->fNotVerbose   =    0;  // skip line-by-line print-out 
    pPars->iFrame        =    0;  // explored up to this frame
    pPars->nFailOuts     =    0;  // the number of failed outputs
    pPars->nDropOuts     =    0;  // the number of dropped outputs
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SFATdscvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesAdd < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fDumpFrames ^= 1;
            break;
        case 's':
            pPars->fUseSynth ^= 1;
            break;
        case 'c':
            pPars->fUseOldCnf ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmc(): There is no AIG.\n" );
        return 0;
    }
    if ( !pPars->fUseOldCnf && !Sdm_ManCanRead() )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmc(): Cannot input precomputed DSD information.\n" );
        return 0;
    }
    pAbc->Status  = Gia_ManBmcPerform( pAbc->pGia, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &bmc [-SFAT num] [-dscvwh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking\n" );
    Abc_Print( -2, "\t-S num : the starting timeframe [default = %d]\n",                      pPars->nStart );
    Abc_Print( -2, "\t-F num : the maximum number of timeframes [default = %d]\n",            pPars->nFramesMax );
    Abc_Print( -2, "\t-A num : the number of additional frames to unroll [default = %d]\n",   pPars->nFramesAdd );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-d     : toggle dumping unfolded timeframes [default = %s]\n",          pPars->fDumpFrames?  "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle synthesizing unrolled timeframes [default = %s]\n",     pPars->fUseSynth?    "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using old CNF computation [default = %s]\n",            pPars->fUseOldCnf?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing information about unfolding [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}